

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

QVariant * __thiscall
QHash<QString,_QVariant>::value
          (QVariant *__return_storage_ptr__,QHash<QString,_QVariant> *this,QString *key)

{
  QVariant *pQVar1;
  
  pQVar1 = valueImpl<QString>(this,key);
  if (pQVar1 == (QVariant *)0x0) {
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
    (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
    *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
  }
  else {
    QVariant::QVariant(__return_storage_ptr__,pQVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

T value(const Key &key) const noexcept
    {
        if (T *v = valueImpl(key))
            return *v;
        else
            return T();
    }